

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cgroup_controller.cpp
# Opt level: O3

void __thiscall CgroupController::close_enter_fd(CgroupController *this)

{
  int iVar1;
  ContextManager *pCVar2;
  string local_38;
  
  iVar1 = close(this->enter_fd_);
  if (iVar1 != 0) {
    pCVar2 = ContextManager::get();
    format_abi_cxx11_(&local_38,"Cannot close cgroups tasks file: %m");
    (**pCVar2->_vptr_ContextManager)(pCVar2,&local_38);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_38._M_dataplus._M_p != &local_38.field_2) {
      operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
    }
  }
  this->enter_fd_ = -1;
  return;
}

Assistant:

void CgroupController::close_enter_fd() {
    if (close(enter_fd_) != 0) {
        die(format("Cannot close cgroups tasks file: %m"));
    }
    enter_fd_ = -1;
}